

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void zsat_solver_restart_seed(sat_solver *s,double seed)

{
  Sat_Mem_t *p;
  int iVar1;
  clause *pcVar2;
  long lVar3;
  int in_R8D;
  long lVar4;
  
  p = &s->Mem;
  Sat_MemRestart(p);
  s->hLearnts = -1;
  iVar1 = Sat_MemAppend(p,(int *)0x0,2,0,in_R8D);
  s->hBinary = iVar1;
  pcVar2 = Sat_MemClauseHand(p,iVar1);
  s->binary = pcVar2;
  veci_resize(&s->trail_lim,0);
  veci_resize(&s->order,0);
  iVar1 = s->size;
  lVar3 = 4;
  for (lVar4 = 0; SBORROW8(lVar4,(long)iVar1 * 2) != lVar4 + (long)iVar1 * -2 < 0; lVar4 = lVar4 + 1
      ) {
    *(undefined4 *)((long)&s->wlists->cap + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  }
  s->nDBreduces = 0;
  s->size = 0;
  s->qhead = 0;
  s->qtail = 0;
  s->VarActType = 0;
  s->ClaActType = 0;
  s->var_inc = 0x20;
  s->var_decay = 0xffffffffffffffff;
  s->cla_inc = 0x800;
  s->cla_decay = 0xffffffff;
  veci_resize(&s->act_clas,0);
  s->root_level = 0;
  s->random_seed = seed;
  s->progress_estimate = 0.0;
  s->verbosity = 0;
  (s->stats).starts = 0;
  (s->stats).clauses = 0;
  (s->stats).learnts = 0;
  (s->stats).decisions = 0;
  (s->stats).propagations = 0;
  (s->stats).inspects = 0;
  (s->stats).conflicts = 0;
  (s->stats).clauses_literals = 0;
  (s->stats).learnts_literals = 0;
  (s->stats).tot_literals = 0;
  return;
}

Assistant:

void zsat_solver_restart_seed( sat_solver* s, double seed )
{
    int i;
    Sat_MemRestart( &s->Mem );
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    veci_resize(&s->trail_lim, 0);
    veci_resize(&s->order, 0);
    for ( i = 0; i < s->size*2; i++ )
        s->wlists[i].size = 0;

    s->nDBreduces = 0;

    // initialize other vars
    s->size                   = 0;
//    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_resize(&s->act_clas, 0);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = seed;
    s->progress_estimate      = 0;
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
}